

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

vector<Tigre::String,_std::allocator<Tigre::String>_> * __thiscall
Tigre::String::explode
          (vector<Tigre::String,_std::allocator<Tigre::String>_> *__return_storage_ptr__,
          String *this,String *delimitador)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  String local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<Tigre::String,_std::allocator<Tigre::String>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tigre::String,_std::allocator<Tigre::String>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tigre::String,_std::allocator<Tigre::String>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (this->value)._M_string_length;
  uVar4 = 0;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      iVar1 = (int)uVar4;
      if (uVar2 <= (ulong)(long)((int)uVar3 + (int)(delimitador->value)._M_string_length + -1))
      break;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)this);
      String(&local_b0,&local_90);
      if (local_b0.value._M_string_length == (delimitador->value)._M_string_length) {
        if (local_b0.value._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar1 = bcmp(local_b0.value._M_dataplus._M_p,(delimitador->value)._M_dataplus._M_p,
                       local_b0.value._M_string_length);
          bVar5 = iVar1 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
        operator_delete(local_b0.value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (bVar5) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
        String(&local_b0,&local_70);
        std::vector<Tigre::String,_std::allocator<Tigre::String>_>::emplace_back<Tigre::String>
                  (__return_storage_ptr__,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
          operator_delete(local_b0.value._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        uVar4 = (ulong)(uint)((int)(delimitador->value)._M_string_length + (int)uVar3);
      }
      iVar1 = (int)uVar4;
      uVar3 = uVar3 + 1;
      uVar2 = (this->value)._M_string_length;
    } while (uVar3 < uVar2);
    uVar4 = (ulong)iVar1;
  }
  if (uVar4 < uVar2) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this);
    String(&local_b0,&local_50);
    std::vector<Tigre::String,_std::allocator<Tigre::String>_>::emplace_back<Tigre::String>
              (__return_storage_ptr__,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
      operator_delete(local_b0.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tigre::String> Tigre::String::explode(String delimitador) {
    std::vector<Tigre::String> result;
    int last_push = 0;

    for (int i=0; i < this->value.size() && i+delimitador.Count()-1 < this->value.size(); i++) {
        if(this->value.substr(i, delimitador.Count()) == delimitador){
            result.push_back(this->value.substr(last_push, i-last_push));
            last_push = i+delimitador.Count();
        }
    }

    if(last_push < this->value.size()){
        result.push_back(this->value.substr(last_push, this->value.size()-last_push));
    }

    return result;
}